

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O1

int Scl_CommandDumpGen(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  float fVar5;
  double dVar6;
  float local_44;
  float local_40;
  uint local_3c;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_3c = 4;
  local_40 = 200.0;
  local_44 = 0.0;
  do {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"SGMvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (0x4c < iVar3) break;
      if (iVar3 == -1) {
        if ((SC_Lib *)pAbc->pLibScl != (SC_Lib *)0x0) {
          if (globalUtilOptind + 1 == argc) {
            pcVar4 = argv[globalUtilOptind];
          }
          else {
            pcVar4 = (char *)0x0;
          }
          Abc_SclDumpGenlib(pcVar4,(SC_Lib *)pAbc->pLibScl,local_44,local_40,local_3c);
          return 0;
        }
        fwrite("There is no Liberty library available.\n",0x27,1,(FILE *)pAbc->Err);
        goto LAB_0044ee0c;
      }
      if (iVar3 != 0x47) goto LAB_0044ee0c;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-G\" should be followed by a floating point number.\n";
        goto LAB_0044ee00;
      }
      dVar6 = atof(argv[globalUtilOptind]);
      fVar5 = (float)dVar6;
      local_40 = fVar5;
LAB_0044ed4c:
      globalUtilOptind = iVar2 + 1;
      if (fVar5 <= 0.0) goto LAB_0044ee0c;
    }
    if (iVar3 != 0x4d) {
      if (iVar3 == 0x53) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-S\" should be followed by a floating point number.\n";
          goto LAB_0044ee00;
        }
        dVar6 = atof(argv[globalUtilOptind]);
        fVar5 = (float)dVar6;
        local_44 = fVar5;
        goto LAB_0044ed4c;
      }
      break;
    }
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-M\" should be followed by a positive integer.\n";
LAB_0044ee00:
      Abc_Print(-1,pcVar4);
      break;
    }
    local_3c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (-1 < (int)local_3c);
LAB_0044ee0c:
  fwrite("usage: dump_genlib [-SG float] [-M num] [-vh] <file>\n",0x35,1,(FILE *)pAbc->Err);
  fwrite("\t           writes GENLIB file for SCL library\n",0x2f,1,(FILE *)pAbc->Err);
  fprintf((FILE *)pAbc->Err,
          "\t-S float : the slew parameter used to generate the library [default = %.2f]\n",
          (double)local_44);
  fprintf((FILE *)pAbc->Err,
          "\t-G float : the gain parameter used to generate the library [default = %.2f]\n",
          (double)local_40);
  fprintf((FILE *)pAbc->Err,
          "\t-M num   : skip gate classes whose size is less than this [default = %d]\n",
          (ulong)local_3c);
  pcVar4 = "yes";
  if (!bVar1) {
    pcVar4 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
          pcVar4);
  fwrite("\t-h       : print the command usage\n",0x24,1,(FILE *)pAbc->Err);
  fwrite("\t<file>   : optional GENLIB file name\n",0x26,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int Scl_CommandDumpGen( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName = NULL;
    float Slew = 0; // use the library
    float Gain = 200;
    int nGatesMin = 4;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SGMvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Slew = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Slew <= 0.0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Gain = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Gain <= 0.0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nGatesMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nGatesMin < 0 ) 
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pLibScl == NULL )
    {
        fprintf( pAbc->Err, "There is no Liberty library available.\n" );
        goto usage;
    }
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    Abc_SclDumpGenlib( pFileName, (SC_Lib *)pAbc->pLibScl, Slew, Gain, nGatesMin );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: dump_genlib [-SG float] [-M num] [-vh] <file>\n" );
    fprintf( pAbc->Err, "\t           writes GENLIB file for SCL library\n" );
    fprintf( pAbc->Err, "\t-S float : the slew parameter used to generate the library [default = %.2f]\n", Slew );
    fprintf( pAbc->Err, "\t-G float : the gain parameter used to generate the library [default = %.2f]\n", Gain );
    fprintf( pAbc->Err, "\t-M num   : skip gate classes whose size is less than this [default = %d]\n", nGatesMin );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    fprintf( pAbc->Err, "\t<file>   : optional GENLIB file name\n");
    return 1;
}